

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo6.cpp
# Opt level: O0

void intrin(state *s)

{
  pointer __rhs;
  bool bVar1;
  uint __seed;
  int iVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  reference puVar5;
  rep rVar6;
  uint *elem;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  scope scope;
  int sum;
  int i;
  undefined1 local_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> v;
  state *s_local;
  type duration;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  type duration_1;
  
  v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)s;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  __seed = picobench::state::iterations
                     ((state *)v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  srand(__seed);
  iVar2 = picobench::state::iterations
                    ((state *)v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,(long)iVar2);
  sum = 0;
  while( true ) {
    iVar2 = picobench::state::iterations
                      ((state *)v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    __rhs = v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    if (iVar2 <= sum) break;
    iVar2 = rand();
    scope._state._4_4_ = iVar2 + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,
               (value_type_conflict *)((long)&scope._state + 4));
    sum = sum + 1;
  }
  scope._state._0_4_ = 0;
  uVar4 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)__rhs = uVar4;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  elem = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&elem);
    if (!bVar1) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    uVar3 = count_bits(*puVar5);
    scope._state._0_4_ = uVar3 + (int)scope._state;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  duration_1.__r = (rep)__rhs;
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_18.__r = (rep)std::chrono::operator-
                                (&local_20,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)__rhs);
  local_28.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_18);
  rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_28);
  *(rep *)(__rhs + 2) = rVar6;
  picobench::state::set_result
            ((state *)v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(long)(int)scope._state);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  return;
}

Assistant:

void intrin(picobench::state& s)
{
    std::vector<uint32_t> v;
    srand(s.iterations());
    v.reserve(s.iterations());

    for (int i = 0; i<s.iterations(); ++i) {
        v.push_back(rand() + 1);
    }

    int sum = 0;

    {
        picobench::scope scope(s);
        for (const auto& elem : v) {
            sum += count_bits(elem);
        }
    }

    s.set_result(sum);
}